

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O0

vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *
upb::generator::SortedMessages
          (vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *__return_storage_ptr__,
          FileDefPtr file)

{
  int iVar1;
  MessageDefPtr message;
  int local_20;
  int i;
  FileDefPtr file_local;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *messages;
  
  _i = file.ptr_;
  file_local.ptr_ = (upb_FileDef *)__return_storage_ptr__;
  std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::vector
            (__return_storage_ptr__);
  for (local_20 = 0; iVar1 = FileDefPtr::toplevel_message_count((FileDefPtr *)&i), local_20 < iVar1;
      local_20 = local_20 + 1) {
    message = FileDefPtr::toplevel_message((FileDefPtr *)&i,local_20);
    AddMessages(message,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<upb::MessageDefPtr> SortedMessages(upb::FileDefPtr file) {
  std::vector<upb::MessageDefPtr> messages;
  for (int i = 0; i < file.toplevel_message_count(); i++) {
    AddMessages(file.toplevel_message(i), &messages);
  }
  return messages;
}